

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::processFunctions(TranslateToFuzzReader *this)

{
  Random *this_00;
  Module *pMVar1;
  long *plVar2;
  undefined8 *puVar3;
  Name *__args;
  bool bVar4;
  char *pcVar5;
  iterator iVar6;
  uint32_t uVar7;
  long lVar8;
  undefined8 *puVar9;
  value_type *pvVar10;
  Call *left;
  Block *pBVar11;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  long extraout_RDX;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  long *plVar12;
  Builder *pBVar13;
  ulong uVar14;
  undefined1 *puVar15;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_3;
  Function **ppFVar16;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_2;
  ulong uVar17;
  Name NVar18;
  optional<wasm::Type> type;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_98;
  ulong local_80;
  Builder *local_78;
  uint32_t local_6c;
  undefined1 auStack_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> noParamsOrResultFuncs;
  Function **local_48;
  iterator iStack_40;
  Function **local_38;
  
  local_48 = (Function **)0x0;
  iStack_40._M_current = (Function **)0x0;
  local_38 = (Function **)0x0;
  pMVar1 = this->wasm;
  plVar12 = *(long **)(pMVar1 + 0x18);
  plVar2 = *(long **)(pMVar1 + 0x20);
  if (plVar12 == plVar2) {
    pBVar13 = *(Builder **)pMVar1;
    puVar15 = *(undefined1 **)(pMVar1 + 8);
    local_80 = (long)puVar15 - (long)pBVar13;
  }
  else {
    do {
      if ((((Function *)*plVar12)->super_Importable).module.super_IString.str._M_str == (char *)0x0)
      {
        auStack_68 = (undefined1  [8])*plVar12;
        std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
                  ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&local_48,
                   (Function **)auStack_68);
      }
      iVar6._M_current = iStack_40._M_current;
      plVar12 = plVar12 + 1;
    } while (plVar12 != plVar2);
    pBVar13 = *(Builder **)this->wasm;
    puVar15 = *(undefined1 **)(this->wasm + 8);
    local_80 = (long)puVar15 - (long)pBVar13;
    for (ppFVar16 = local_48; ppFVar16 != iVar6._M_current; ppFVar16 = ppFVar16 + 1) {
      addInvocations(this,*ppFVar16);
    }
  }
  this_00 = &this->random;
  local_6c = Random::upTo(this_00,0xb);
  local_78 = pBVar13;
  if ((this->random).finishedInput == false) {
    do {
      if (local_48 == iStack_40._M_current) {
LAB_00127a8a:
        auStack_68 = (undefined1  [8])addFunction(this);
        addInvocations(this,(Function *)auStack_68);
        if (this->allowOOB == true) {
          if (iStack_40._M_current == local_38) {
            std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
            _M_realloc_insert<wasm::Function*const&>
                      ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&local_48,
                       iStack_40,(Function **)auStack_68);
          }
          else {
            *iStack_40._M_current = (Function *)auStack_68;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
      }
      else {
        uVar7 = Random::upTo(this_00,10);
        if (local_6c <= uVar7) goto LAB_00127a8a;
        uVar7 = Random::upTo(this_00,(uint32_t)
                                     ((ulong)((long)iStack_40._M_current - (long)local_48) >> 3));
        modFunction(this,local_48[uVar7]);
        local_48[uVar7] = iStack_40._M_current[-1];
        iStack_40._M_current = iStack_40._M_current + -1;
      }
    } while ((this->random).finishedInput != true);
  }
  auStack_68 = (undefined1  [8])0x0;
  noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar9 = *(undefined8 **)(this->wasm + 0x18);
  puVar3 = *(undefined8 **)(this->wasm + 0x20);
  if (puVar9 != puVar3) {
    local_80 = (long)local_80 >> 3;
    do {
      lVar8 = wasm::HeapType::getSignature();
      if (lVar8 == 0) {
        wasm::HeapType::getSignature();
        if (extraout_RDX == 0) {
          __args = (Name *)*puVar9;
          if (noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                      ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_68,
                       (iterator)
                       noParamsOrResultFuncs.
                       super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                       super__Vector_impl_data._M_start,__args);
          }
          else {
            pcVar5 = (__args->super_IString).str._M_str;
            ((noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_len =
                 (__args->super_IString).str._M_len;
            ((noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar5;
            noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar3);
    if ((auStack_68 !=
         (undefined1  [8])
         noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
         super__Vector_impl_data._M_start) && ((Builder *)puVar15 != local_78)) {
      local_78 = &this->builder;
      uVar14 = 0;
      uVar17 = 1;
      do {
        lVar8 = *(long *)this->wasm;
        if (*(int *)(*(long *)(lVar8 + uVar14 * 8) + 0x10) == 0) {
          uVar7 = Random::upTo(this_00,10);
          if (uVar7 < local_6c) {
            lVar8 = *(long *)(lVar8 + uVar14 * 8);
            if (*(char *)(lVar8 + 0x28) == '\0') {
              puVar9 = (undefined8 *)(lVar8 + 0x18);
            }
            else {
              puVar9 = (undefined8 *)0x0;
            }
            NVar18.super_IString.str._M_str = (char *)*puVar9;
            NVar18.super_IString.str._M_len = (size_t)this->wasm;
            lVar8 = wasm::Module::getFunction(NVar18);
            if (*(long *)(lVar8 + 0x20) == 0) {
              pvVar10 = Random::pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                                  (this_00,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                                           auStack_68);
              local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              args = &local_98;
              left = Builder::makeCall(local_78,(Name)(pvVar10->super_IString).str,args,(Type)0x0,
                                       false);
              if (local_98.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_98.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_98.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_98.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args
              ;
              pBVar11 = Builder::makeSequence
                                  (local_78,(Expression *)left,*(Expression **)(lVar8 + 0x60),type);
              *(Block **)(lVar8 + 0x60) = pBVar11;
            }
          }
        }
        bVar4 = uVar17 < local_80;
        uVar14 = uVar17;
        uVar17 = (ulong)((int)uVar17 + 1);
      } while (bVar4);
    }
  }
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    puVar3 = *(undefined8 **)(this->wasm + 0x20);
    for (puVar9 = *(undefined8 **)(this->wasm + 0x18); puVar9 != puVar3; puVar9 = puVar9 + 1) {
      if ((((Function *)*puVar9)->super_Importable).module.super_IString.str._M_str == (char *)0x0)
      {
        addHangLimitChecks(this,(Function *)*puVar9);
      }
    }
  }
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)noParamsOrResultFuncs.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  if (local_48 != (Function **)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::processFunctions() {
  // Functions that are eligible for being modded. We only do so once to each
  // function, at most, so once we do we remove it from here.
  std::vector<Function*> moddable;

  // Defined initial functions are moddable.
  for (auto& func : wasm.functions) {
    if (!func->imported()) {
      moddable.push_back(func.get());
    }
  }

  auto numInitialExports = wasm.exports.size();

  // Add invocations, which can help execute the code here even if the function
  // was not exported (or was exported but with a signature that traps
  // immediately, like receiving a non-nullable ref, that the fuzzer can't
  // provide from JS). Note we cannot iterate on wasm.functions because
  // addInvocations modifies that.
  for (auto* func : moddable) {
    addInvocations(func);
  }

  // We do not want to always mod in the same frequency. Pick a chance to mod a
  // function. When the chance is maximal we will mod every single function, and
  // immediately after creating it; when the chance is minimal we will not mod
  // anything; values in the middle will end up randomly modding some functions,
  // at random times (random times are useful because we might create function
  // A, then B, then mod A, and since B has already been created, the modding of
  // A may lead to calls to B).
  const int RESOLUTION = 10;
  auto chance = upTo(RESOLUTION + 1);

  // Keep working while we have random data.
  while (!random.finished()) {
    if (!moddable.empty() && upTo(RESOLUTION) < chance) {
      // Mod an existing function.
      auto index = upTo(moddable.size());
      auto* func = moddable[index];
      modFunction(func);

      // Remove this function from the vector by swapping the last item to its
      // place, and truncating.
      moddable[index] = moddable.back();
      moddable.pop_back();
    } else {
      // Add a new function
      auto* func = addFunction();
      addInvocations(func);

      // It may be modded later, if we allow out-of-bounds: we emit OOB checks
      // in the code we just generated, and any changes could break that.
      if (allowOOB) {
        moddable.push_back(func);
      }
    }
  }

  // Interpose on initial exports. When initial content contains exports, it can
  // be useful to add new code that executes in them, rather than just adding
  // new exports later. To some extent modifying the initially-exported function
  // gives us that, but typically these are small changes, not calls to entirely
  // new code (and this is especially important when preserveImportsAndExports,
  // as in that mode we do not add new exports, so this interposing is our main
  // chance to run new code using the existing exports).
  //
  // Interpose with a call before the old code. We do a call here so that we end
  // up running a useful amount of new code (rather than just make(none) which
  // would only emit something local in the current function, and which depends
  // on its contents).
  // TODO: We could also interpose after, either in functions without results,
  //       or by saving the results to a temp local as we call.
  //
  // Specifically, we will call functions, for simplicity, with no params or
  // results. Such functions exist in abundance in general, because the
  // invocations we add look exactly that way. First, find all such functions,
  // and then find places to interpose calls to them.
  std::vector<Name> noParamsOrResultFuncs;
  for (auto& func : wasm.functions) {
    if (func->getParams() == Type::none && func->getResults() == Type::none) {
      noParamsOrResultFuncs.push_back(func->name);
    }
  }
  if (!noParamsOrResultFuncs.empty()) {
    for (Index i = 0; i < numInitialExports; i++) {
      auto& exp = wasm.exports[i];
      if (exp->kind == ExternalKind::Function && upTo(RESOLUTION) < chance) {
        auto* func = wasm.getFunction(*exp->getInternalName());
        if (!func->imported()) {
          auto* call =
            builder.makeCall(pick(noParamsOrResultFuncs), {}, Type::none);
          func->body = builder.makeSequence(call, func->body);
        }
      }
    }
  }

  // At the very end, add hang limit checks (so no modding can override them).
  if (fuzzParams->HANG_LIMIT > 0) {
    for (auto& func : wasm.functions) {
      if (!func->imported()) {
        addHangLimitChecks(func.get());
      }
    }
  }
}